

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Int_t * Pdr_InvMap(Vec_Int_t *vCounts)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  
  pVVar2 = Vec_IntStart(vCounts->nSize);
  lVar4 = 0;
  iVar3 = 0;
  do {
    if (vCounts->nSize <= lVar4) {
      return pVVar2;
    }
    iVar1 = Vec_IntEntry(vCounts,(int)lVar4);
    if (iVar1 != 0) {
      if (pVVar2->nSize <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar2->pArray[lVar4] = iVar3;
      iVar3 = iVar3 + 1;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Pdr_InvMap( Vec_Int_t * vCounts )
{
    int i, k = 0, Count;
    Vec_Int_t * vMap = Vec_IntStart( Vec_IntSize(vCounts) );
    Vec_IntForEachEntry( vCounts, Count, i )
        if ( Count )
            Vec_IntWriteEntry( vMap, i, k++ );
    return vMap;
}